

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O0

boolean is_ok_location(level *lev,schar x,schar y,int humidity)

{
  char cVar1;
  boolean bVar2;
  int typ;
  int humidity_local;
  schar y_local;
  schar x_local;
  level *lev_local;
  
  bVar2 = on_level(&lev->z,&dungeon_topology.d_water_level);
  if (bVar2 == '\0') {
    if (((humidity & 1U) == 0) ||
       ((((cVar1 = lev->locations[x][y].typ, cVar1 != '\x19' && (cVar1 != '%')) && (cVar1 != '&'))
        && ((cVar1 != '\"' && (cVar1 != '\x18')))))) {
      if (((humidity & 2U) == 0) ||
         ((bVar2 = is_pool(lev,(int)x,(int)y), bVar2 == '\0' &&
          (bVar2 = is_lava(lev,(int)x,(int)y), bVar2 == '\0')))) {
        lev_local._7_1_ = '\0';
      }
      else {
        lev_local._7_1_ = '\x01';
      }
    }
    else {
      lev_local._7_1_ = '\x01';
    }
  }
  else {
    lev_local._7_1_ = '\x01';
  }
  return lev_local._7_1_;
}

Assistant:

static boolean is_ok_location(struct level *lev, schar x, schar y, int humidity)
{
	int typ;

	if (Is_waterlevel(&lev->z)) return TRUE;	/* accept any spot */

	if (humidity & DRY) {
	    typ = lev->locations[x][y].typ;
	    if (typ == ROOM || typ == AIR ||
		typ == CLOUD || typ == ICE || typ == CORR)
		return TRUE;
	}
	if (humidity & WET) {
	    if (is_pool(lev, x, y) || is_lava(lev, x, y))
		return TRUE;
	}
	return FALSE;
}